

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<EnumNameValue>::relocate
          (QArrayDataPointer<EnumNameValue> *this,qsizetype offset,EnumNameValue **data)

{
  bool bVar1;
  EnumNameValue *in_RDX;
  long in_RSI;
  EnumNameValue *in_RDI;
  EnumNameValue **unaff_retaddr;
  EnumNameValue *res;
  char16_t *n;
  EnumNameValue *c;
  
  n = (in_RDI->name).d.ptr + in_RSI * 0x1c;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<EnumNameValue,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (EnumNameValue *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<EnumNameValue>,EnumNameValue_const*>
                        (unaff_retaddr,(QArrayDataPointer<EnumNameValue> *)c), bVar1)) {
    (in_RDX->name).d.d = (Data *)(in_RSI * 0x38 + (long)(in_RDX->name).d.d);
  }
  (in_RDI->name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }